

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Shutdown(ImGuiContext *context)

{
  int *piVar1;
  ImFontAtlas *p;
  char *pcVar2;
  ImGuiWindow **ppIVar3;
  ImGuiColorMod *pIVar4;
  ImGuiStyleMod *pIVar5;
  ImFont **ppIVar6;
  ImGuiPopupData *pIVar7;
  ImGuiPtrOrIndex *pIVar8;
  ImGuiShrinkWidthItem *pIVar9;
  ImGuiSettingsHandler *pIVar10;
  FILE *__stream;
  ImGuiContext *pIVar11;
  long lVar12;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar11 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded == true) &&
       (pcVar2 = (context->IO).IniFilename, pcVar2 != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(pcVar2);
    }
    GImGui = pIVar11;
    if (0 < (context->Windows).Size) {
      lVar12 = 0;
      do {
        IM_DELETE<ImGuiWindow>((context->Windows).Data[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (context->Windows).Size);
    }
    ppIVar3 = (context->Windows).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (context->Windows).Size = 0;
      (context->Windows).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      (context->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar3 = (context->WindowsFocusOrder).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (context->WindowsFocusOrder).Size = 0;
      (context->WindowsFocusOrder).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      (context->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
    }
    ppIVar3 = (context->WindowsSortBuffer).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (context->WindowsSortBuffer).Size = 0;
      (context->WindowsSortBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      (context->WindowsSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ppIVar3 = (context->CurrentWindowStack).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (context->CurrentWindowStack).Size = 0;
      (context->CurrentWindowStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      (context->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
    }
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredRootWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    pIVar4 = (context->ColorModifiers).Data;
    if (pIVar4 != (ImGuiColorMod *)0x0) {
      (context->ColorModifiers).Size = 0;
      (context->ColorModifiers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      (context->ColorModifiers).Data = (ImGuiColorMod *)0x0;
    }
    pIVar5 = (context->StyleModifiers).Data;
    if (pIVar5 != (ImGuiStyleMod *)0x0) {
      (context->StyleModifiers).Size = 0;
      (context->StyleModifiers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (context->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar6 = (context->FontStack).Data;
    if (ppIVar6 != (ImFont **)0x0) {
      (context->FontStack).Size = 0;
      (context->FontStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
      (context->FontStack).Data = (ImFont **)0x0;
    }
    pIVar7 = (context->OpenPopupStack).Data;
    if (pIVar7 != (ImGuiPopupData *)0x0) {
      (context->OpenPopupStack).Size = 0;
      (context->OpenPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      (context->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    pIVar7 = (context->BeginPopupStack).Data;
    if (pIVar7 != (ImGuiPopupData *)0x0) {
      (context->BeginPopupStack).Size = 0;
      (context->BeginPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      (context->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    ImDrawDataBuilder::ClearFreeMemory(&context->DrawDataBuilder);
    ImDrawList::ClearFreeMemory(&context->BackgroundDrawList);
    ImDrawList::ClearFreeMemory(&context->ForegroundDrawList);
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    pIVar8 = (context->CurrentTabBarStack).Data;
    if (pIVar8 != (ImGuiPtrOrIndex *)0x0) {
      (context->CurrentTabBarStack).Size = 0;
      (context->CurrentTabBarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
      (context->CurrentTabBarStack).Data = (ImGuiPtrOrIndex *)0x0;
    }
    pIVar9 = (context->ShrinkWidthBuffer).Data;
    if (pIVar9 != (ImGuiShrinkWidthItem *)0x0) {
      (context->ShrinkWidthBuffer).Size = 0;
      (context->ShrinkWidthBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (context->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)0x0;
    }
    pcVar2 = (context->PrivateClipboard).Data;
    if (pcVar2 != (char *)0x0) {
      (context->PrivateClipboard).Size = 0;
      (context->PrivateClipboard).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      (context->PrivateClipboard).Data = (char *)0x0;
    }
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    pIVar10 = (context->SettingsHandlers).Data;
    if (pIVar10 != (ImGuiSettingsHandler *)0x0) {
      (context->SettingsHandlers).Size = 0;
      (context->SettingsHandlers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      (context->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
    }
    __stream = (FILE *)context->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream != _stdout) {
        fclose(__stream);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&context->LogBuffer);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(context);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();
    g.DrawDataBuilder.ClearFreeMemory();
    g.BackgroundDrawList.ClearFreeMemory();
    g.ForegroundDrawList.ClearFreeMemory();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.PrivateClipboard.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}